

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_face_curve_tol(REF_GRID ref_grid,REF_INT faceid,REF_DBL *curve,REF_DBL *location)

{
  uint uVar1;
  REF_INT local_104;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  REF_INT local_e0;
  int local_dc;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL curvature_ratio;
  REF_DBL slop;
  REF_DBL hs;
  REF_DBL hr;
  REF_DBL s [3];
  REF_DBL ks;
  REF_DBL r [3];
  double local_68;
  REF_DBL kr;
  REF_DBL rlimit;
  REF_DBL delta_radian;
  REF_DBL hmax;
  REF_INT face_geom;
  REF_INT item;
  REF_INT node;
  REF_INT edge_geom;
  REF_GEOM ref_geom;
  REF_DBL *location_local;
  REF_DBL *curve_local;
  REF_GRID pRStack_18;
  REF_INT faceid_local;
  REF_GRID ref_grid_local;
  
  _node = ref_grid->geom;
  *curve = 2.0;
  *location = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;
  ref_geom = (REF_GEOM)location;
  location_local = curve;
  curve_local._4_4_ = faceid;
  pRStack_18 = ref_grid;
  uVar1 = ref_egads_diagonal(_node,-1,&delta_radian);
  if (uVar1 == 0) {
    for (hmax._0_4_ = 0; hmax._0_4_ < _node->max; hmax._0_4_ = hmax._0_4_ + 1) {
      if ((_node->descr[hmax._0_4_ * 6] == 2) &&
         (curve_local._4_4_ == _node->descr[hmax._0_4_ * 6 + 1])) {
        face_geom = _node->descr[hmax._0_4_ * 6 + 5];
        if ((face_geom < 0) || (_node->ref_adj->nnode <= face_geom)) {
          local_dc = -1;
        }
        else {
          local_dc = _node->ref_adj->first[face_geom];
        }
        hmax._4_4_ = local_dc;
        if (local_dc == -1) {
          local_e0 = -1;
        }
        else {
          local_e0 = _node->ref_adj->item[local_dc].ref;
        }
        item = local_e0;
        while (hmax._4_4_ != -1) {
          if (_node->descr[item * 6] == 1) {
            uVar1 = ref_geom_radian_request(_node,item,&rlimit);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xa9b,"ref_geom_face_curve_tol",(ulong)uVar1,"drad");
              return uVar1;
            }
            kr = delta_radian / rlimit;
            uVar1 = ref_egads_face_curvature(_node,hmax._0_4_,&local_68,&ks,s + 2,&hr);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xa9e,"ref_geom_face_curve_tol",(ulong)uVar1,"curve");
              return uVar1;
            }
            if (local_68 <= 0.0) {
              local_e8 = -local_68;
            }
            else {
              local_e8 = local_68;
            }
            if (s[2] <= 0.0) {
              local_f0 = -s[2];
            }
            else {
              local_f0 = s[2];
            }
            if (local_e8 <= local_f0 * 0.05) {
              local_f8 = local_f0 * 0.05;
            }
            else {
              local_f8 = local_e8;
            }
            local_68 = local_f8;
            if (local_f0 <= local_f8 * 0.05) {
              local_100 = local_f8 * 0.05;
            }
            else {
              local_100 = local_f0;
            }
            s[2] = local_100;
            hs = delta_radian;
            if (1.0 / kr < local_f8) {
              hs = rlimit / local_f8;
            }
            slop = delta_radian;
            if (1.0 / kr < local_100) {
              slop = rlimit / local_100;
            }
            uVar1 = ref_geom_reliability(_node,hmax._0_4_,&curvature_ratio);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xaaa,"ref_geom_face_curve_tol",(ulong)uVar1,"edge tol");
              return uVar1;
            }
            if ((hs < curvature_ratio) && (hs / curvature_ratio < *location_local)) {
              *location_local = hs / curvature_ratio;
              *(REF_DBL *)ref_geom = pRStack_18->node->real[face_geom * 0xf];
              *(REF_DBL *)&ref_geom->blank = pRStack_18->node->real[face_geom * 0xf + 1];
              ref_geom->descr = (REF_INT *)pRStack_18->node->real[face_geom * 0xf + 2];
            }
            if ((slop < curvature_ratio) && (slop / curvature_ratio < *location_local)) {
              *location_local = slop / curvature_ratio;
              *(REF_DBL *)ref_geom = pRStack_18->node->real[face_geom * 0xf];
              *(REF_DBL *)&ref_geom->blank = pRStack_18->node->real[face_geom * 0xf + 1];
              ref_geom->descr = (REF_INT *)pRStack_18->node->real[face_geom * 0xf + 2];
            }
          }
          hmax._4_4_ = _node->ref_adj->item[hmax._4_4_].next;
          if (hmax._4_4_ == -1) {
            local_104 = -1;
          }
          else {
            local_104 = _node->ref_adj->item[hmax._4_4_].ref;
          }
          item = local_104;
        }
      }
    }
    ref_grid_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xa94,
           "ref_geom_face_curve_tol",(ulong)uVar1,"bbox diag");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_face_curve_tol(REF_GRID ref_grid,
                                                  REF_INT faceid,
                                                  REF_DBL *curve,
                                                  REF_DBL *location) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);

  REF_INT edge_geom, node;
  REF_INT item, face_geom;
  REF_DBL hmax, delta_radian, rlimit;
  REF_DBL kr, r[3], ks, s[3];
  REF_DBL hr, hs, slop;
  REF_DBL curvature_ratio = 1.0 / 20.0;

  *curve = 2.0;
  location[0] = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;

  RSS(ref_egads_diagonal(ref_geom, REF_EMPTY, &hmax), "bbox diag");

  each_ref_geom_face(ref_geom, face_geom) {
    if (faceid != ref_geom_id(ref_geom, face_geom)) continue;
    node = ref_geom_node(ref_geom, face_geom);
    each_ref_geom_having_node(ref_geom, node, item, edge_geom) {
      if (REF_GEOM_EDGE != ref_geom_type(ref_geom, edge_geom)) continue;
      RSS(ref_geom_radian_request(ref_geom, edge_geom, &delta_radian), "drad");
      rlimit = hmax / delta_radian; /* h = r*drad, r = h/drad */
      RSS(ref_egads_face_curvature(ref_geom, face_geom, &kr, r, &ks, s),
          "curve");
      /* ignore sign, k is 1 / radius */
      kr = ABS(kr);
      ks = ABS(ks);
      /* limit the aspect ratio of the metric by reducing the largest radius */
      kr = MAX(kr, curvature_ratio * ks);
      ks = MAX(ks, curvature_ratio * kr);
      hr = hmax;
      if (1.0 / rlimit < kr) hr = delta_radian / kr;
      hs = hmax;
      if (1.0 / rlimit < ks) hs = delta_radian / ks;

      RSS(ref_geom_reliability(ref_geom, face_geom, &slop), "edge tol");
      if (hr < slop) {
        if (*curve > hr / slop) {
          *curve = hr / slop;
          location[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, node);
          location[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, node);
          location[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, node);
        }
      }
      if (hs < slop) {
        if (*curve > hs / slop) {
          *curve = hs / slop;
          location[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, node);
          location[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, node);
          location[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, node);
        }
      }
    }
  }
  return REF_SUCCESS;
}